

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recorder.cpp
# Opt level: O1

void __thiscall helics::apps::Recorder::writeJsonFile(Recorder *this,string *filename)

{
  value_t vVar1;
  json_value jVar2;
  pointer pVVar3;
  pointer puVar4;
  Time TVar5;
  Message *pMVar6;
  size_t __n;
  ulong uVar7;
  byte *pbVar8;
  bool bVar9;
  int iVar10;
  difference_type __node_offset_1;
  reference pvVar11;
  _Elt_pointer pIVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val;
  string *val_00;
  ostream *poVar13;
  difference_type __node_offset;
  long lVar14;
  pointer puVar15;
  undefined8 uVar16;
  Input *this_00;
  data *pdVar17;
  undefined1 auVar18 [8];
  string *val_01;
  string_view str2encode;
  json doc;
  json message;
  ofstream out;
  data local_398;
  data local_388;
  data local_378;
  data local_368;
  data local_350;
  data local_340;
  data local_330;
  data local_320;
  data local_310;
  data local_300;
  data local_2f0;
  data local_2e0;
  data local_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2c0;
  size_t local_2b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b0;
  data local_2a0;
  data local_290;
  data local_280;
  string *local_270;
  pointer local_268;
  data local_260;
  data local_250;
  data local_240;
  undefined1 local_230 [8];
  json_value local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220 [14];
  ios_base local_138 [264];
  
  local_398.m_type = null;
  local_398.m_value.object = (object_t *)0x0;
  local_270 = filename;
  if ((this->points).
      super__Vector_base<helics::apps::Recorder::ValueCapture,_std::allocator<helics::apps::Recorder::ValueCapture>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->points).
      super__Vector_base<helics::apps::Recorder::ValueCapture,_std::allocator<helics::apps::Recorder::ValueCapture>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_240,(initializer_list_t)ZEXT816(0),false,array);
    pvVar11 = nlohmann::json_abi_v3_11_3::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          *)&local_398,"points");
    vVar1 = (pvVar11->m_data).m_type;
    (pvVar11->m_data).m_type = local_240.m_type;
    jVar2 = (pvVar11->m_data).m_value;
    (pvVar11->m_data).m_value = local_240.m_value;
    local_240.m_type = vVar1;
    local_240.m_value = jVar2;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&local_240);
    pVVar3 = (this->points).
             super__Vector_base<helics::apps::Recorder::ValueCapture,_std::allocator<helics::apps::Recorder::ValueCapture>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_268 = (this->points).
                super__Vector_base<helics::apps::Recorder::ValueCapture,_std::allocator<helics::apps::Recorder::ValueCapture>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    if (pVVar3 != local_268) {
      do {
        val_01 = &pVVar3->value;
        local_230 = (undefined1  [8])((ulong)local_230 & 0xffffffffffffff00);
        local_228.object = (object_t *)0x0;
        pIVar12 = (this->subscriptions).
                  super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
                  super__Deque_impl_data._M_start._M_cur;
        lVar14 = ((long)pIVar12 -
                  (long)(this->subscriptions).
                        super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
                        super__Deque_impl_data._M_start._M_first >> 4) * -0x79435e50d79435e5 +
                 (long)*(int *)((long)(val_01 + -1) + 0x18);
        if (lVar14 == 0) {
          pIVar12 = pIVar12 + *(int *)((long)(val_01 + -1) + 0x18);
        }
        else {
          pIVar12 = (this->subscriptions).
                    super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
                    super__Deque_impl_data._M_start._M_node[lVar14];
        }
        if ((pIVar12->givenTarget)._M_string_length == 0) {
          val = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                Interface::getSourceTargets_abi_cxx11_(&pIVar12->super_Interface);
        }
        else {
          val = &pIVar12->givenTarget;
        }
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_2d0,val);
        pvVar11 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)local_230,"key");
        vVar1 = (pvVar11->m_data).m_type;
        (pvVar11->m_data).m_type = local_2d0.m_type;
        jVar2 = (pvVar11->m_data).m_value;
        (pvVar11->m_data).m_value = local_2d0.m_value;
        local_2d0.m_type = vVar1;
        local_2d0.m_value = jVar2;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&local_2d0);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_2a0,val_01);
        pvVar11 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)local_230,"value");
        vVar1 = (pvVar11->m_data).m_type;
        (pvVar11->m_data).m_type = local_2a0.m_type;
        jVar2 = (pvVar11->m_data).m_value;
        (pvVar11->m_data).m_value = local_2a0.m_value;
        local_2a0.m_type = vVar1;
        local_2a0.m_value = jVar2;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&local_2a0);
        local_368.m_type = null;
        local_368._1_7_ = 0;
        local_368.m_value.object = (object_t *)0x0;
        nlohmann::json_abi_v3_11_3::detail::
        external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)7>::
        construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_368,
                   (double)(*(long *)((long)(val_01 + -1) + 0x10) % 1000000000) * 1e-09 +
                   (double)(*(long *)((long)(val_01 + -1) + 0x10) / 1000000000));
        pvVar11 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)local_230,"time");
        vVar1 = (pvVar11->m_data).m_type;
        (pvVar11->m_data).m_type = local_368.m_type;
        local_368.m_type = vVar1;
        jVar2 = (pvVar11->m_data).m_value;
        (pvVar11->m_data).m_value.object = (object_t *)local_368.m_value;
        local_368.m_value = jVar2;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&local_368);
        if (0 < *(short *)((long)(val_01 + -1) + 0x1c)) {
          local_378.m_type = null;
          local_378._1_7_ = 0;
          local_378.m_value.object = (object_t *)0x0;
          nlohmann::json_abi_v3_11_3::detail::
          external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
          construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_378,(long)*(short *)((long)(val_01 + -1) + 0x1c));
          pvVar11 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                *)local_230,"iteration");
          vVar1 = (pvVar11->m_data).m_type;
          (pvVar11->m_data).m_type = local_378.m_type;
          local_378.m_type = vVar1;
          jVar2 = (pvVar11->m_data).m_value;
          (pvVar11->m_data).m_value.object = (object_t *)local_378.m_value;
          local_378.m_value = jVar2;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(&local_378);
        }
        if (*(char *)((long)(val_01 + -1) + 0x1e) == '\x01') {
          pIVar12 = (this->subscriptions).
                    super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
                    super__Deque_impl_data._M_start._M_cur;
          lVar14 = ((long)pIVar12 -
                    (long)(this->subscriptions).
                          super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
                          super__Deque_impl_data._M_start._M_first >> 4) * -0x79435e50d79435e5 +
                   (long)*(int *)((long)(val_01 + -1) + 0x18);
          if (lVar14 == 0) {
            this_00 = pIVar12 + *(int *)((long)(val_01 + -1) + 0x18);
          }
          else {
            this_00 = (this->subscriptions).
                      super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
                      super__Deque_impl_data._M_start._M_node[lVar14];
          }
          val_00 = Input::getPublicationType_abi_cxx11_(this_00);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_2e0,val_00);
          pvVar11 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                *)local_230,"type");
          vVar1 = (pvVar11->m_data).m_type;
          (pvVar11->m_data).m_type = local_2e0.m_type;
          jVar2 = (pvVar11->m_data).m_value;
          (pvVar11->m_data).m_value = local_2e0.m_value;
          local_2e0.m_type = vVar1;
          local_2e0.m_value = jVar2;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(&local_2e0);
        }
        pvVar11 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)&local_398,"points");
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::push_back(pvVar11,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                             *)local_230);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data((data *)local_230);
        pVVar3 = (pointer)(val_01 + 1);
      } while ((pointer)(val_01 + 1) != local_268);
    }
  }
  if ((this->messages).
      super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->messages).
      super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_250,(initializer_list_t)ZEXT816(0),false,array);
    pvVar11 = nlohmann::json_abi_v3_11_3::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          *)&local_398,"messages");
    vVar1 = (pvVar11->m_data).m_type;
    (pvVar11->m_data).m_type = local_250.m_type;
    jVar2 = (pvVar11->m_data).m_value;
    (pvVar11->m_data).m_value = local_250.m_value;
    local_250.m_type = vVar1;
    local_250.m_value = jVar2;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&local_250);
    puVar15 = (this->messages).
              super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar4 = (this->messages).
             super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar15 != puVar4) {
      do {
        local_260.m_type = null;
        local_260.m_value.object = (object_t *)0x0;
        TVar5.internalTimeCode =
             (((puVar15->_M_t).
               super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
               super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
               super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl)->time).internalTimeCode
        ;
        local_388.m_type = null;
        local_388._1_7_ = 0;
        local_388.m_value.object = (object_t *)0x0;
        nlohmann::json_abi_v3_11_3::detail::
        external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)7>::
        construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_388,
                   (double)(TVar5.internalTimeCode % 1000000000) * 1e-09 +
                   (double)(TVar5.internalTimeCode / 1000000000));
        pvVar11 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)&local_260,"time");
        vVar1 = (pvVar11->m_data).m_type;
        (pvVar11->m_data).m_type = local_388.m_type;
        local_388.m_type = vVar1;
        jVar2 = (pvVar11->m_data).m_value;
        (pvVar11->m_data).m_value.object = (object_t *)local_388.m_value;
        local_388.m_value = jVar2;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&local_388);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_2f0,
                   &((puVar15->_M_t).
                     super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                     .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl)->source);
        pvVar11 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)&local_260,"src");
        vVar1 = (pvVar11->m_data).m_type;
        (pvVar11->m_data).m_type = local_2f0.m_type;
        jVar2 = (pvVar11->m_data).m_value;
        (pvVar11->m_data).m_value = local_2f0.m_value;
        local_2f0.m_type = vVar1;
        local_2f0.m_value = jVar2;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&local_2f0);
        pMVar6 = (puVar15->_M_t).
                 super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
                 super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
                 super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
        __n = (pMVar6->original_source)._M_string_length;
        if ((__n != 0) &&
           ((__n != (pMVar6->source)._M_string_length ||
            (iVar10 = bcmp((pMVar6->original_source)._M_dataplus._M_p,
                           (pMVar6->source)._M_dataplus._M_p,__n), iVar10 != 0)))) {
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_300,&pMVar6->original_source);
          pvVar11 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                *)&local_260,"original_source");
          vVar1 = (pvVar11->m_data).m_type;
          (pvVar11->m_data).m_type = local_300.m_type;
          jVar2 = (pvVar11->m_data).m_value;
          (pvVar11->m_data).m_value = local_300.m_value;
          local_300.m_type = vVar1;
          local_300.m_value = jVar2;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(&local_300);
        }
        pMVar6 = (puVar15->_M_t).
                 super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
                 super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
                 super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
        uVar7 = (pMVar6->dest)._M_string_length;
        if ((uVar7 < 7) ||
           (iVar10 = CLI::std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                               (&pMVar6->dest,uVar7 - 6,6,"cloneE"), iVar10 != 0)) {
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_310,
                     &((puVar15->_M_t).
                       super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                       .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl)->dest);
          pvVar11 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                *)&local_260,"dest");
          vVar1 = (pvVar11->m_data).m_type;
          (pvVar11->m_data).m_type = local_310.m_type;
          jVar2 = (pvVar11->m_data).m_value;
          (pvVar11->m_data).m_value = local_310.m_value;
          local_310.m_type = vVar1;
          local_310.m_value = jVar2;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(&local_310);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_280,
                     &((puVar15->_M_t).
                       super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                       .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl)->original_dest
                    );
          pvVar11 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                *)&local_260,"orig_dest");
          vVar1 = (pvVar11->m_data).m_type;
          (pvVar11->m_data).m_type = local_280.m_type;
          local_280.m_type = vVar1;
          pdVar17 = &local_280;
        }
        else {
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_290,
                     &((puVar15->_M_t).
                       super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                       .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl)->original_dest
                    );
          pvVar11 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                *)&local_260,"dest");
          vVar1 = (pvVar11->m_data).m_type;
          (pvVar11->m_data).m_type = local_290.m_type;
          pdVar17 = &local_290;
          local_290.m_type = vVar1;
        }
        jVar2 = (pvVar11->m_data).m_value;
        (pvVar11->m_data).m_value = pdVar17->m_value;
        pdVar17->m_value = jVar2;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(pdVar17);
        bVar9 = isBinaryData(&((puVar15->_M_t).
                               super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                               .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl)->data)
        ;
        if (bVar9) {
          bVar9 = isEscapableData(&((puVar15->_M_t).
                                    super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                                    .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl)->
                                   data);
          if (bVar9) {
            pMVar6 = (puVar15->_M_t).
                     super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                     .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
            pbVar8 = (pMVar6->data).heap;
            local_230 = (undefined1  [8])(local_230 + 0x10);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_230,pbVar8,pbVar8 + (pMVar6->data).bufferSize);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_320,(string *)local_230);
            pvVar11 = nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                      ::operator[]<char_const>
                                ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                  *)&local_260,"message");
            vVar1 = (pvVar11->m_data).m_type;
            (pvVar11->m_data).m_type = local_320.m_type;
            jVar2 = (pvVar11->m_data).m_value;
            (pvVar11->m_data).m_value = local_320.m_value;
            pdVar17 = &local_320;
            local_320.m_type = vVar1;
            local_320.m_value = jVar2;
            goto LAB_001d31a9;
          }
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::basic_json<const_char_(&)[7],_char[7],_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_330,(char (*) [7])"base64");
          pvVar11 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                *)&local_260,"encoding");
          vVar1 = (pvVar11->m_data).m_type;
          (pvVar11->m_data).m_type = local_330.m_type;
          jVar2 = (pvVar11->m_data).m_value;
          (pvVar11->m_data).m_value = local_330.m_value;
          local_330.m_type = vVar1;
          local_330.m_value = jVar2;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(&local_330);
          pMVar6 = (puVar15->_M_t).
                   super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
                   super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
          pbVar8 = (pMVar6->data).heap;
          local_2c0 = &local_2b0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2c0,pbVar8,pbVar8 + (pMVar6->data).bufferSize);
          str2encode._M_str = (char *)local_2c0;
          str2encode._M_len = local_2b8;
          encode_abi_cxx11_((string *)local_230,str2encode);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_340,(string *)local_230);
          pvVar11 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                *)&local_260,"message");
          vVar1 = (pvVar11->m_data).m_type;
          (pvVar11->m_data).m_type = local_340.m_type;
          jVar2 = (pvVar11->m_data).m_value;
          (pvVar11->m_data).m_value = local_340.m_value;
          local_340.m_type = vVar1;
          local_340.m_value = jVar2;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(&local_340);
          if (local_230 != (undefined1  [8])(local_230 + 0x10)) {
            operator_delete((void *)local_230,local_220[0]._M_allocated_capacity + 1);
          }
          uVar16 = local_2b0._M_allocated_capacity;
          auVar18 = (undefined1  [8])local_2c0;
          if (local_2c0 != &local_2b0) goto LAB_001d32e6;
        }
        else {
          pMVar6 = (puVar15->_M_t).
                   super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
                   super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
          pbVar8 = (pMVar6->data).heap;
          local_230 = (undefined1  [8])(local_230 + 0x10);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_230,pbVar8,pbVar8 + (pMVar6->data).bufferSize);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_350,(string *)local_230);
          pvVar11 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                *)&local_260,"message");
          vVar1 = (pvVar11->m_data).m_type;
          (pvVar11->m_data).m_type = local_350.m_type;
          jVar2 = (pvVar11->m_data).m_value;
          (pvVar11->m_data).m_value = local_350.m_value;
          pdVar17 = &local_350;
          local_350.m_type = vVar1;
          local_350.m_value = jVar2;
LAB_001d31a9:
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(pdVar17);
          uVar16 = local_220[0]._M_allocated_capacity;
          auVar18 = local_230;
          if (local_230 != (undefined1  [8])(local_230 + 0x10)) {
LAB_001d32e6:
            operator_delete((void *)auVar18,uVar16 + 1);
          }
        }
        pvVar11 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)&local_398,"messages");
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::push_back(pvVar11,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                             *)&local_260);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&local_260);
        puVar15 = puVar15 + 1;
      } while (puVar15 != puVar4);
    }
  }
  std::ofstream::ofstream(local_230,(string *)local_270,_S_out);
  poVar13 = nlohmann::json_abi_v3_11_3::operator<<
                      ((ostream *)local_230,
                       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_398);
  local_2c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_2c0._1_7_,10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar13,(char *)&local_2c0,1);
  local_230 = (undefined1  [8])_VTT;
  *(undefined8 *)(local_230 + *(long *)(_VTT + -0x18)) = _pthread_mutex_unlock;
  std::filebuf::~filebuf((filebuf *)(local_230 + 8));
  std::ios_base::~ios_base(local_138);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data(&local_398);
  return;
}

Assistant:

void Recorder::writeJsonFile(const std::string& filename)
{
    nlohmann::json doc;
    if (!points.empty()) {
        doc["points"] = nlohmann::json(nlohmann::json::array());
        for (auto& point : points) {
            nlohmann::json pointData;
            pointData["key"] = subscriptions[point.index].getTarget();
            pointData["value"] = point.value;
            pointData["time"] = static_cast<double>(point.time);
            if (point.iteration > 0) {
                pointData["iteration"] = point.iteration;
            }
            if (point.first) {
                pointData["type"] = subscriptions[point.index].getPublicationType();
            }
            doc["points"].push_back(pointData);
        }
    }

    if (!messages.empty()) {
        doc["messages"] = nlohmann::json(nlohmann::json::array());
        for (auto& mess : messages) {
            nlohmann::json message;
            message["time"] = static_cast<double>(mess->time);
            message["src"] = mess->source;
            if ((!mess->original_source.empty()) && (mess->original_source != mess->source)) {
                message["original_source"] = mess->original_source;
            }
            if ((mess->dest.size() < 7) ||
                (mess->dest.compare(mess->dest.size() - 6, 6, "cloneE") != 0)) {
                message["dest"] = mess->dest;
                message["orig_dest"] = mess->original_dest;
            } else {
                message["dest"] = mess->original_dest;
            }
            if (isBinaryData(mess->data)) {
                if (isEscapableData(mess->data)) {
                    message["message"] = std::string(mess->data.to_string());
                } else {
                    message["encoding"] = "base64";
                    message["message"] = encode(std::string(mess->data.to_string()));
                }

            } else {
                message["message"] = std::string(mess->data.to_string());
            }
            doc["messages"].push_back(message);
        }
    }

    std::ofstream out(filename);
    out << doc << '\n';
}